

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O3

bool isInlinedScript(TextFilePos *errorPos,char *script_name)

{
  pointer pTVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined1 extraout_AL;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  
  iVar4 = strncmp(script_name,"[string \"script ",0x10);
  if (((iVar4 == 0) &&
      (uVar5 = atoi(script_name + 0x10),
      pTVar1 = scripts_origin.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_start, -1 < (int)uVar5)) &&
     (uVar6 = ((long)scripts_origin.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)scripts_origin.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
     (int)uVar5 < (int)uVar6)) {
    uVar7 = (ulong)uVar5;
    if (uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
      errorPos->colEnd =
           scripts_origin.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7].colEnd;
      pTVar1 = pTVar1 + uVar7;
      uVar2 = pTVar1->line;
      uVar3 = pTVar1->colBegin;
      errorPos->filename = pTVar1->filename;
      errorPos->line = uVar2;
      errorPos->colBegin = uVar3;
      return true;
    }
    pcVar8 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    pcVar8 = lua_tolstring((lua_State *)pcVar8,-1,(size_t *)0x0);
    Error(pcVar8,(char *)0x0,FATAL);
    return (bool)extraout_AL;
  }
  return false;
}

Assistant:

static bool isInlinedScript(TextFilePos & errorPos, const char* script_name) {
	// return false when the script is external (real file name)
	if (script_name != strstr(script_name, "[string \"script ")) return false;
	// inlined script, find it's origin and add line number to that
	int scriptNumber = atoi(script_name + 16);
	if (scriptNumber < 0 || int(scripts_origin.size()) <= scriptNumber) return false;
	errorPos = scripts_origin.at(scriptNumber);
	return true;
}